

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int file_read(file_t *file,uchar *buf,size_t size)

{
  uint uVar1;
  
  if (file == (file_t *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",0x18,
                  "int file_read(file_t *, unsigned char *, size_t)");
  }
  if (buf != (uchar *)0x0) {
    if (size != 0) {
      uVar1 = unix_read(file->fd,buf,size);
      if (0 < (int)uVar1) {
        file->pos = file->pos + (ulong)uVar1;
      }
      return uVar1;
    }
    __assert_fail("size > 0","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",
                  0x1a,"int file_read(file_t *, unsigned char *, size_t)");
  }
  __assert_fail("buf != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c"
                ,0x19,"int file_read(file_t *, unsigned char *, size_t)");
}

Assistant:

int file_read(file_t *file, unsigned char *buf, size_t size) {
  assert(file != NULL);
  assert(buf != NULL);
  assert(size > 0);

  int res = unix_read(file->fd, buf, size);
  if (res > 0) {
    file->pos += res;
  }
  return res;
}